

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tristrip.cpp
# Opt level: O0

void __thiscall rw::Geometry::buildTristrips(Geometry *this)

{
  MeshHeader *pMVar1;
  Mesh *pMVar2;
  Mesh *m;
  int local_6c;
  undefined1 local_68 [4];
  int32 i_1;
  StripMesh smesh;
  Mesh *md;
  Mesh *ms;
  MeshHeader *header;
  uint16 *indices;
  int32 i;
  Geometry *this_local;
  
  allocateMeshes(this,(this->matList).numMaterials,0,1);
  m = (Mesh *)0x1000f;
  smesh._0_8_ = mustmalloc_LOC((long)this->numTriangles * 0x38,0x1000f,
                               "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/tristrip.cpp line: 575"
                              );
  pMVar2 = MeshHeader::getMeshes(this->meshHeader);
  for (local_6c = 0; local_6c < (this->matList).numMaterials; local_6c = local_6c + 1) {
    LinkList::init((LinkList *)&smesh.nodes,(EVP_PKEY_CTX *)m);
    LinkList::init((LinkList *)&smesh.loneNodes.link.prev,(EVP_PKEY_CTX *)m);
    collectFaces(this,(StripMesh *)local_68,(uint16)local_6c);
    connectNodesPreserve((StripMesh *)local_68);
    buildStrips((StripMesh *)local_68);
    printSmesh((StripMesh *)local_68);
    pMVar2[local_6c].material = (this->matList).materials[local_6c];
    m = pMVar2 + local_6c;
    makeMesh((StripMesh *)local_68,m);
    this->meshHeader->totalIndices = pMVar2[local_6c].numIndices + this->meshHeader->totalIndices;
  }
  (*DAT_001660a8)(smesh._0_8_);
  pMVar1 = this->meshHeader;
  this->meshHeader = (MeshHeader *)0x0;
  allocateMeshes(this,(uint)pMVar1->numMeshes,pMVar1->totalIndices,0);
  this->meshHeader->flags = 1;
  smesh.endNodes.link.prev = (LLLink *)MeshHeader::getMeshes(this->meshHeader);
  header = (MeshHeader *)((Mesh *)smesh.endNodes.link.prev)->indices;
  for (indices._4_4_ = 0; indices._4_4_ < (int)(uint)pMVar1->numMeshes;
      indices._4_4_ = indices._4_4_ + 1) {
    *(Material **)((long)smesh.endNodes.link.prev + (long)indices._4_4_ * 0x18 + 0x10) =
         pMVar2[indices._4_4_].material;
    *(uint32 *)((long)smesh.endNodes.link.prev + (long)indices._4_4_ * 0x18 + 8) =
         pMVar2[indices._4_4_].numIndices;
    *(MeshHeader **)((long)smesh.endNodes.link.prev + (long)indices._4_4_ * 0x18) = header;
    header = (MeshHeader *)
             ((long)&header->flags +
             (ulong)*(uint *)((long)smesh.endNodes.link.prev + (long)indices._4_4_ * 0x18 + 8) * 2);
    memcpy(*(void **)((long)smesh.endNodes.link.prev + (long)indices._4_4_ * 0x18),
           pMVar2[indices._4_4_].indices,
           (ulong)*(uint *)((long)smesh.endNodes.link.prev + (long)indices._4_4_ * 0x18 + 8) << 1);
    (*DAT_001660a8)(pMVar2[indices._4_4_].indices);
  }
  (*DAT_001660a8)(pMVar1);
  verifyMesh(this);
  return;
}

Assistant:

void
Geometry::buildTristrips(void)
{
	int32 i;
	uint16 *indices;
	MeshHeader *header;
	Mesh *ms, *md;
	StripMesh smesh;

//	trace("%ld\n", sizeof(StripNode));

	this->allocateMeshes(matList.numMaterials, 0, 1);

	smesh.nodes = rwNewT(StripNode, this->numTriangles, MEMDUR_FUNCTION | ID_GEOMETRY);
	ms = this->meshHeader->getMeshes();
	for(int32 i = 0; i < this->matList.numMaterials; i++){
		smesh.loneNodes.init();
		smesh.endNodes.init();
		collectFaces(this, &smesh, i);
		connectNodesPreserve(&smesh);
		buildStrips(&smesh);
printSmesh(&smesh);
//trace("-------\n");
//printLone(&smesh);
//trace("-------\n");
//printEnds(&smesh);
//trace("-------\n");
		// TODO: make this work
//		tunnel(&smesh);
//trace("-------\n");
//printEnds(&smesh);

		ms[i].material = this->matList.materials[i];
		makeMesh(&smesh, &ms[i]);
		this->meshHeader->totalIndices += ms[i].numIndices;
	}
	rwFree(smesh.nodes);

	/* Now re-allocate and copy data */
	header = this->meshHeader;
	this->meshHeader = nil;
	this->allocateMeshes(header->numMeshes, header->totalIndices, 0);
	this->meshHeader->flags = MeshHeader::TRISTRIP;
	md = this->meshHeader->getMeshes();
	indices = md->indices;
	for(i = 0; i < header->numMeshes; i++){
		md[i].material = ms[i].material;
		md[i].numIndices = ms[i].numIndices;
		md[i].indices = indices;
		indices += md[i].numIndices;
		memcpy(md[i].indices, ms[i].indices, md[i].numIndices*sizeof(uint16));
		rwFree(ms[i].indices);
	}
	rwFree(header);

	verifyMesh(this);
}